

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 (*pauVar60) [16];
  uint uVar61;
  AABBNodeMB4D *node1;
  ulong uVar62;
  long lVar63;
  long lVar64;
  int iVar65;
  ulong uVar66;
  ulong uVar67;
  undefined1 (*pauVar68) [16];
  ulong uVar69;
  long lVar70;
  undefined1 (*pauVar71) [16];
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  Scene *scene;
  long lVar81;
  ulong uVar82;
  ulong uVar83;
  float fVar142;
  undefined1 auVar136 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar95;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [64];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar109;
  undefined1 auVar104 [32];
  undefined1 auVar100 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar134;
  undefined1 auVar133 [64];
  float fVar135;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [64];
  float fVar146;
  uint uVar147;
  float fVar149;
  float fVar150;
  uint uVar151;
  float fVar152;
  float fVar153;
  uint uVar154;
  float fVar155;
  uint uVar156;
  float fVar157;
  uint uVar158;
  float fVar159;
  uint uVar160;
  undefined1 auVar148 [32];
  uint uVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [32];
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar190 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_29c0) [16];
  undefined8 local_2990;
  undefined8 uStack_2988;
  undefined8 *local_2980;
  ulong local_2978;
  ulong local_2970;
  ulong local_2968;
  Scene *local_2960;
  long local_2958;
  long local_2950;
  ulong local_2948;
  ulong local_2940;
  ulong local_2938;
  ulong local_2930;
  ulong local_2928;
  long local_2920;
  ulong local_2918;
  RTCFilterFunctionNArguments local_2910;
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  undefined1 local_2830 [8];
  float fStack_2828;
  float fStack_2824;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  undefined1 local_2810 [8];
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  undefined1 local_27f0 [8];
  float fStack_27e8;
  float fStack_27e4;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  undefined1 local_27d0 [8];
  float fStack_27c8;
  float fStack_27c4;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  undefined1 local_27b0 [8];
  float fStack_27a8;
  float fStack_27a4;
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  undefined1 local_2790 [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  RTCHitN local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined4 local_2710;
  undefined4 uStack_270c;
  undefined4 uStack_2708;
  undefined4 uStack_2704;
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  uint local_26e0;
  uint uStack_26dc;
  uint uStack_26d8;
  uint uStack_26d4;
  uint uStack_26d0;
  uint uStack_26cc;
  uint uStack_26c8;
  uint uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  undefined4 uStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined4 uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar119 [64];
  
  local_29c0 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23e0._4_4_ = uVar3;
  local_23e0._0_4_ = uVar3;
  local_23e0._8_4_ = uVar3;
  local_23e0._12_4_ = uVar3;
  local_23e0._16_4_ = uVar3;
  local_23e0._20_4_ = uVar3;
  local_23e0._24_4_ = uVar3;
  local_23e0._28_4_ = uVar3;
  auVar129 = ZEXT3264(local_23e0);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2400._4_4_ = uVar3;
  local_2400._0_4_ = uVar3;
  local_2400._8_4_ = uVar3;
  local_2400._12_4_ = uVar3;
  local_2400._16_4_ = uVar3;
  local_2400._20_4_ = uVar3;
  local_2400._24_4_ = uVar3;
  local_2400._28_4_ = uVar3;
  auVar133 = ZEXT3264(local_2400);
  uVar3 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2420._4_4_ = uVar3;
  local_2420._0_4_ = uVar3;
  local_2420._8_4_ = uVar3;
  local_2420._12_4_ = uVar3;
  local_2420._16_4_ = uVar3;
  local_2420._20_4_ = uVar3;
  local_2420._24_4_ = uVar3;
  local_2420._28_4_ = uVar3;
  auVar139 = ZEXT3264(local_2420);
  local_2440 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2460 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2480 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2968 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2970 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2978 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar67 = local_2968 ^ 0x20;
  uVar69 = local_2970 ^ 0x20;
  iVar65 = (tray->tnear).field_0.i[k];
  local_24a0._4_4_ = iVar65;
  local_24a0._0_4_ = iVar65;
  local_24a0._8_4_ = iVar65;
  local_24a0._12_4_ = iVar65;
  local_24a0._16_4_ = iVar65;
  local_24a0._20_4_ = iVar65;
  local_24a0._24_4_ = iVar65;
  local_24a0._28_4_ = iVar65;
  auVar182 = ZEXT3264(local_24a0);
  iVar65 = (tray->tfar).field_0.i[k];
  auVar92 = ZEXT3264(CONCAT428(iVar65,CONCAT424(iVar65,CONCAT420(iVar65,CONCAT416(iVar65,CONCAT412(
                                                  iVar65,CONCAT48(iVar65,CONCAT44(iVar65,iVar65)))))
                                               )));
  local_24c0._16_16_ = mm_lookupmask_ps._240_16_;
  local_24c0._0_16_ = mm_lookupmask_ps._0_16_;
  uVar78 = local_2978 ^ 0x20;
  local_2980 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = &DAT_3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar119 = ZEXT3264(auVar116);
  auVar102._8_4_ = 0xbf800000;
  auVar102._0_8_ = 0xbf800000bf800000;
  auVar102._12_4_ = 0xbf800000;
  auVar102._16_4_ = 0xbf800000;
  auVar102._20_4_ = 0xbf800000;
  auVar102._24_4_ = 0xbf800000;
  auVar102._28_4_ = 0xbf800000;
  _local_24e0 = vblendvps_avx(auVar116,auVar102,local_24c0);
  fStack_243c = local_2440;
  fStack_2438 = local_2440;
  fStack_2434 = local_2440;
  fStack_2430 = local_2440;
  fStack_242c = local_2440;
  fStack_2428 = local_2440;
  fStack_2424 = local_2440;
  fStack_245c = local_2460;
  fStack_2458 = local_2460;
  fStack_2454 = local_2460;
  fStack_2450 = local_2460;
  fStack_244c = local_2460;
  fStack_2448 = local_2460;
  fStack_2444 = local_2460;
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  uVar66 = local_2970;
  uVar72 = local_2978;
  uVar73 = local_2968;
  fVar84 = local_2440;
  fVar93 = local_2440;
  fVar94 = local_2440;
  fVar95 = local_2440;
  fVar96 = local_2440;
  fVar97 = local_2440;
  fVar98 = local_2440;
  fVar109 = local_2460;
  fVar152 = local_2460;
  fVar134 = local_2460;
  fVar165 = local_2460;
  fVar167 = local_2460;
  fVar169 = local_2460;
  fVar171 = local_2460;
  fVar173 = local_2480;
  fVar175 = local_2480;
  fVar176 = local_2480;
  fVar177 = local_2480;
  fVar178 = local_2480;
  fVar179 = local_2480;
  fVar180 = local_2480;
  do {
    do {
      do {
        if (local_29c0 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar60 = local_29c0 + -1;
        auVar108 = ZEXT464((uint)*(float *)(*pauVar60 + 8));
        local_29c0 = local_29c0 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar60 + 8));
      uVar82 = *(ulong *)*local_29c0;
      do {
        auVar137 = auVar139._0_32_;
        auVar116 = auVar133._0_32_;
        auVar102 = auVar129._0_32_;
        if ((uVar82 & 8) == 0) {
          uVar62 = uVar82 & 0xfffffffffffffff0;
          fVar4 = *(float *)(ray + k * 4 + 0x70);
          auVar112._4_4_ = fVar4;
          auVar112._0_4_ = fVar4;
          auVar112._8_4_ = fVar4;
          auVar112._12_4_ = fVar4;
          auVar112._16_4_ = fVar4;
          auVar112._20_4_ = fVar4;
          auVar112._24_4_ = fVar4;
          auVar112._28_4_ = fVar4;
          pfVar2 = (float *)(uVar62 + 0x100 + uVar73);
          pfVar1 = (float *)(uVar62 + 0x40 + uVar73);
          auVar103._0_4_ = fVar4 * *pfVar2 + *pfVar1;
          auVar103._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
          auVar103._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
          auVar103._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
          auVar103._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
          auVar103._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
          auVar103._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
          auVar103._28_4_ = auVar108._28_4_ + pfVar1[7];
          auVar103 = vsubps_avx(auVar103,auVar102);
          auVar37._4_4_ = fVar93 * auVar103._4_4_;
          auVar37._0_4_ = fVar84 * auVar103._0_4_;
          auVar37._8_4_ = fVar94 * auVar103._8_4_;
          auVar37._12_4_ = fVar95 * auVar103._12_4_;
          auVar37._16_4_ = fVar96 * auVar103._16_4_;
          auVar37._20_4_ = fVar97 * auVar103._20_4_;
          auVar37._24_4_ = fVar98 * auVar103._24_4_;
          auVar37._28_4_ = auVar103._28_4_;
          pfVar2 = (float *)(uVar62 + 0x100 + uVar66);
          pfVar1 = (float *)(uVar62 + 0x40 + uVar66);
          auVar117._0_4_ = fVar4 * *pfVar2 + *pfVar1;
          auVar117._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
          auVar117._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
          auVar117._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
          auVar117._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
          auVar117._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
          auVar117._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
          auVar117._28_4_ = auVar119._28_4_ + pfVar1[7];
          auVar103 = vmaxps_avx(auVar182._0_32_,auVar37);
          auVar37 = vsubps_avx(auVar117,auVar116);
          pfVar2 = (float *)(uVar62 + 0x100 + uVar72);
          auVar38._4_4_ = fVar152 * auVar37._4_4_;
          auVar38._0_4_ = fVar109 * auVar37._0_4_;
          auVar38._8_4_ = fVar134 * auVar37._8_4_;
          auVar38._12_4_ = fVar165 * auVar37._12_4_;
          auVar38._16_4_ = fVar167 * auVar37._16_4_;
          auVar38._20_4_ = fVar169 * auVar37._20_4_;
          auVar38._24_4_ = fVar171 * auVar37._24_4_;
          auVar38._28_4_ = auVar37._28_4_;
          pfVar1 = (float *)(uVar62 + 0x40 + uVar72);
          auVar122._0_4_ = fVar4 * *pfVar2 + *pfVar1;
          auVar122._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
          auVar122._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
          auVar122._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
          auVar122._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
          auVar122._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
          auVar122._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
          auVar122._28_4_ = in_ZMM4._28_4_ + pfVar1[7];
          auVar37 = vsubps_avx(auVar122,auVar137);
          auVar39._4_4_ = fVar175 * auVar37._4_4_;
          auVar39._0_4_ = fVar173 * auVar37._0_4_;
          auVar39._8_4_ = fVar176 * auVar37._8_4_;
          auVar39._12_4_ = fVar177 * auVar37._12_4_;
          auVar39._16_4_ = fVar178 * auVar37._16_4_;
          auVar39._20_4_ = fVar179 * auVar37._20_4_;
          fVar14 = auVar37._28_4_;
          auVar39._24_4_ = fVar180 * auVar37._24_4_;
          auVar39._28_4_ = fVar14;
          auVar37 = vmaxps_avx(auVar38,auVar39);
          pfVar2 = (float *)(uVar62 + 0x100 + uVar67);
          local_26c0 = vmaxps_avx(auVar103,auVar37);
          auVar108 = ZEXT3264(local_26c0);
          pfVar1 = (float *)(uVar62 + 0x40 + uVar67);
          auVar118._0_4_ = fVar4 * *pfVar2 + *pfVar1;
          auVar118._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
          auVar118._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
          auVar118._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
          auVar118._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
          auVar118._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
          auVar118._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
          auVar118._28_4_ = fVar14 + pfVar1[7];
          auVar103 = vsubps_avx(auVar118,auVar102);
          pfVar2 = (float *)(uVar62 + 0x100 + uVar69);
          pfVar1 = (float *)(uVar62 + 0x40 + uVar69);
          auVar123._0_4_ = fVar4 * *pfVar2 + *pfVar1;
          auVar123._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
          auVar123._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
          auVar123._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
          auVar123._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
          auVar123._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
          auVar123._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
          auVar123._28_4_ = fVar14 + pfVar1[7];
          auVar42._4_4_ = fVar93 * auVar103._4_4_;
          auVar42._0_4_ = fVar84 * auVar103._0_4_;
          auVar42._8_4_ = fVar94 * auVar103._8_4_;
          auVar42._12_4_ = fVar95 * auVar103._12_4_;
          auVar42._16_4_ = fVar96 * auVar103._16_4_;
          auVar42._20_4_ = fVar97 * auVar103._20_4_;
          auVar42._24_4_ = fVar98 * auVar103._24_4_;
          auVar42._28_4_ = auVar103._28_4_;
          auVar103 = vsubps_avx(auVar123,auVar116);
          pfVar2 = (float *)(uVar62 + 0x100 + uVar78);
          auVar43._4_4_ = fVar152 * auVar103._4_4_;
          auVar43._0_4_ = fVar109 * auVar103._0_4_;
          auVar43._8_4_ = fVar134 * auVar103._8_4_;
          auVar43._12_4_ = fVar165 * auVar103._12_4_;
          auVar43._16_4_ = fVar167 * auVar103._16_4_;
          auVar43._20_4_ = fVar169 * auVar103._20_4_;
          auVar43._24_4_ = fVar171 * auVar103._24_4_;
          auVar43._28_4_ = auVar103._28_4_;
          pfVar1 = (float *)(uVar62 + 0x40 + uVar78);
          auVar126._0_4_ = fVar4 * *pfVar2 + *pfVar1;
          auVar126._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
          auVar126._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
          auVar126._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
          auVar126._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
          auVar126._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
          auVar126._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
          auVar126._28_4_ = in_ZMM5._28_4_ + pfVar1[7];
          auVar103 = vsubps_avx(auVar126,auVar137);
          auVar44._4_4_ = fVar175 * auVar103._4_4_;
          auVar44._0_4_ = fVar173 * auVar103._0_4_;
          auVar44._8_4_ = fVar176 * auVar103._8_4_;
          auVar44._12_4_ = fVar177 * auVar103._12_4_;
          auVar44._16_4_ = fVar178 * auVar103._16_4_;
          auVar44._20_4_ = fVar179 * auVar103._20_4_;
          auVar44._24_4_ = fVar180 * auVar103._24_4_;
          auVar44._28_4_ = auVar103._28_4_;
          in_ZMM5 = ZEXT3264(auVar44);
          auVar37 = vminps_avx(auVar43,auVar44);
          auVar103 = vminps_avx(auVar92._0_32_,auVar42);
          auVar103 = vminps_avx(auVar103,auVar37);
          auVar103 = vcmpps_avx(local_26c0,auVar103,2);
          auVar119 = ZEXT3264(auVar103);
          if (((uint)uVar82 & 7) == 6) {
            auVar37 = vcmpps_avx(*(undefined1 (*) [32])(uVar62 + 0x1c0),auVar112,2);
            auVar38 = vcmpps_avx(auVar112,*(undefined1 (*) [32])(uVar62 + 0x1e0),1);
            auVar38 = vandps_avx(auVar37,auVar38);
            auVar103 = vandps_avx(auVar38,auVar103);
            auVar119 = ZEXT1664(auVar103._16_16_);
            auVar110 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          }
          else {
            auVar110 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          }
          in_ZMM4 = ZEXT3264(auVar37);
          auVar110 = vpsllw_avx(auVar110,0xf);
          auVar110 = vpacksswb_avx(auVar110,auVar110);
          local_2918 = (ulong)(byte)(SUB161(auVar110 >> 7,0) & 1 |
                                     (SUB161(auVar110 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar110 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar110 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar110 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar110 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar110 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar110 >> 0x3f,0) << 7);
        }
        if ((uVar82 & 8) == 0) {
          if (local_2918 == 0) {
            iVar65 = 4;
          }
          else {
            uVar62 = uVar82 & 0xfffffffffffffff0;
            lVar64 = 0;
            if (local_2918 != 0) {
              for (; (local_2918 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
              }
            }
            iVar65 = 0;
            uVar82 = *(ulong *)(uVar62 + lVar64 * 8);
            uVar75 = local_2918 - 1 & local_2918;
            if (uVar75 != 0) {
              uVar147 = *(uint *)(local_26c0 + lVar64 * 4);
              lVar64 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                }
              }
              uVar74 = *(ulong *)(uVar62 + lVar64 * 8);
              uVar61 = *(uint *)(local_26c0 + lVar64 * 4);
              uVar75 = uVar75 - 1 & uVar75;
              if (uVar75 == 0) {
                if (uVar147 < uVar61) {
                  *(ulong *)*local_29c0 = uVar74;
                  *(uint *)(*local_29c0 + 8) = uVar61;
                  local_29c0 = local_29c0 + 1;
                }
                else {
                  *(ulong *)*local_29c0 = uVar82;
                  *(uint *)(*local_29c0 + 8) = uVar147;
                  uVar82 = uVar74;
                  local_29c0 = local_29c0 + 1;
                }
              }
              else {
                auVar110._8_8_ = 0;
                auVar110._0_8_ = uVar82;
                auVar110 = vpunpcklqdq_avx(auVar110,ZEXT416(uVar147));
                auVar100._8_8_ = 0;
                auVar100._0_8_ = uVar74;
                auVar100 = vpunpcklqdq_avx(auVar100,ZEXT416(uVar61));
                lVar64 = 0;
                if (uVar75 != 0) {
                  for (; (uVar75 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                  }
                }
                auVar85._8_8_ = 0;
                auVar85._0_8_ = *(ulong *)(uVar62 + lVar64 * 8);
                auVar85 = vpunpcklqdq_avx(auVar85,ZEXT416(*(uint *)(local_26c0 + lVar64 * 4)));
                auVar136 = vpcmpgtd_avx(auVar100,auVar110);
                uVar75 = uVar75 - 1 & uVar75;
                if (uVar75 == 0) {
                  auVar124 = vpshufd_avx(auVar136,0xaa);
                  auVar136 = vblendvps_avx(auVar100,auVar110,auVar124);
                  auVar110 = vblendvps_avx(auVar110,auVar100,auVar124);
                  auVar100 = vpcmpgtd_avx(auVar85,auVar136);
                  auVar124 = vpshufd_avx(auVar100,0xaa);
                  auVar100 = vblendvps_avx(auVar85,auVar136,auVar124);
                  in_ZMM4 = ZEXT1664(auVar100);
                  auVar85 = vblendvps_avx(auVar136,auVar85,auVar124);
                  auVar136 = vpcmpgtd_avx(auVar85,auVar110);
                  auVar124 = vpshufd_avx(auVar136,0xaa);
                  auVar119 = ZEXT1664(auVar124);
                  auVar136 = vblendvps_avx(auVar85,auVar110,auVar124);
                  in_ZMM5 = ZEXT1664(auVar136);
                  auVar110 = vblendvps_avx(auVar110,auVar85,auVar124);
                  auVar108 = ZEXT1664(auVar110);
                  *local_29c0 = auVar110;
                  local_29c0[1] = auVar136;
                  uVar82 = auVar100._0_8_;
                  local_29c0 = local_29c0 + 2;
                }
                else {
                  lVar64 = 0;
                  if (uVar75 != 0) {
                    for (; (uVar75 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  auVar124._8_8_ = 0;
                  auVar124._0_8_ = *(ulong *)(uVar62 + lVar64 * 8);
                  auVar124 = vpunpcklqdq_avx(auVar124,ZEXT416(*(uint *)(local_26c0 + lVar64 * 4)));
                  uVar75 = uVar75 - 1 & uVar75;
                  if (uVar75 == 0) {
                    auVar99 = vpshufd_avx(auVar136,0xaa);
                    auVar136 = vblendvps_avx(auVar100,auVar110,auVar99);
                    auVar110 = vblendvps_avx(auVar110,auVar100,auVar99);
                    auVar100 = vpcmpgtd_avx(auVar124,auVar85);
                    auVar99 = vpshufd_avx(auVar100,0xaa);
                    auVar100 = vblendvps_avx(auVar124,auVar85,auVar99);
                    auVar85 = vblendvps_avx(auVar85,auVar124,auVar99);
                    auVar124 = vpcmpgtd_avx(auVar85,auVar110);
                    auVar99 = vpshufd_avx(auVar124,0xaa);
                    auVar124 = vblendvps_avx(auVar85,auVar110,auVar99);
                    auVar110 = vblendvps_avx(auVar110,auVar85,auVar99);
                    auVar85 = vpcmpgtd_avx(auVar100,auVar136);
                    auVar99 = vpshufd_avx(auVar85,0xaa);
                    auVar85 = vblendvps_avx(auVar100,auVar136,auVar99);
                    auVar100 = vblendvps_avx(auVar136,auVar100,auVar99);
                    auVar136 = vpcmpgtd_avx(auVar124,auVar100);
                    auVar136 = vpshufd_avx(auVar136,0xaa);
                    auVar99 = vblendvps_avx(auVar124,auVar100,auVar136);
                    auVar100 = vblendvps_avx(auVar100,auVar124,auVar136);
                    *local_29c0 = auVar110;
                    local_29c0[1] = auVar100;
                    local_29c0[2] = auVar99;
                    uVar82 = auVar85._0_8_;
                    local_29c0 = local_29c0 + 3;
                  }
                  else {
                    *local_29c0 = auVar110;
                    local_29c0[1] = auVar100;
                    local_29c0[2] = auVar85;
                    local_29c0[3] = auVar124;
                    lVar64 = 0x30;
                    do {
                      lVar70 = lVar64;
                      lVar64 = 0;
                      if (uVar75 != 0) {
                        for (; (uVar75 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                        }
                      }
                      auVar99._8_8_ = 0;
                      auVar99._0_8_ = *(ulong *)(uVar62 + lVar64 * 8);
                      auVar110 = vpunpcklqdq_avx(auVar99,ZEXT416(*(uint *)(local_26c0 + lVar64 * 4))
                                                );
                      *(undefined1 (*) [16])(local_29c0[1] + lVar70) = auVar110;
                      uVar75 = uVar75 & uVar75 - 1;
                      lVar64 = lVar70 + 0x10;
                    } while (uVar75 != 0);
                    pauVar60 = (undefined1 (*) [16])(local_29c0[1] + lVar70);
                    if (lVar70 + 0x10 != 0) {
                      lVar64 = 0x10;
                      pauVar68 = local_29c0;
                      do {
                        auVar110 = pauVar68[1];
                        uVar147 = *(uint *)(pauVar68[1] + 8);
                        pauVar68 = pauVar68 + 1;
                        lVar70 = lVar64;
                        do {
                          if (uVar147 <= *(uint *)(local_29c0[-1] + lVar70 + 8)) {
                            pauVar71 = (undefined1 (*) [16])(*local_29c0 + lVar70);
                            break;
                          }
                          *(undefined1 (*) [16])(*local_29c0 + lVar70) =
                               *(undefined1 (*) [16])(local_29c0[-1] + lVar70);
                          lVar70 = lVar70 + -0x10;
                          pauVar71 = local_29c0;
                        } while (lVar70 != 0);
                        *pauVar71 = auVar110;
                        lVar64 = lVar64 + 0x10;
                      } while (pauVar60 != pauVar68);
                    }
                    uVar82 = *(ulong *)*pauVar60;
                    local_29c0 = pauVar60;
                  }
                  auVar108 = ZEXT1664(auVar110);
                  in_ZMM5 = ZEXT1664(auVar124);
                  in_ZMM4 = ZEXT1664(auVar136);
                  auVar119 = ZEXT1664(auVar85);
                  auVar129 = ZEXT3264(auVar102);
                  auVar133 = ZEXT3264(auVar116);
                  auVar139 = ZEXT3264(auVar137);
                  auVar182 = ZEXT3264(auVar182._0_32_);
                }
              }
            }
          }
        }
        else {
          iVar65 = 6;
        }
      } while (iVar65 == 0);
    } while (iVar65 != 6);
    local_2958 = (ulong)((uint)uVar82 & 0xf) - 8;
    if (local_2958 != 0) {
      uVar82 = uVar82 & 0xfffffffffffffff0;
      lVar64 = 0;
      do {
        lVar63 = lVar64 * 0x60;
        pSVar7 = context->scene;
        pRVar8 = (pSVar7->geometries).items;
        pGVar9 = pRVar8[*(uint *)(uVar82 + 0x40 + lVar63)].ptr;
        fVar84 = (pGVar9->time_range).lower;
        fVar84 = pGVar9->fnumTimeSegments *
                 ((*(float *)(ray + k * 4 + 0x70) - fVar84) / ((pGVar9->time_range).upper - fVar84))
        ;
        auVar110 = vroundss_avx(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84),9);
        auVar110 = vminss_avx(auVar110,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
        auVar13 = vmaxss_avx(ZEXT816(0) << 0x20,auVar110);
        iVar65 = (int)auVar13._0_4_;
        lVar76 = (long)iVar65 * 0x38;
        lVar70 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar76);
        local_2940 = (ulong)*(uint *)(uVar82 + 4 + lVar63);
        auVar110 = *(undefined1 (*) [16])(lVar70 + (ulong)*(uint *)(uVar82 + lVar63) * 4);
        uVar72 = (ulong)*(uint *)(uVar82 + 0x10 + lVar63);
        auVar100 = *(undefined1 (*) [16])(lVar70 + uVar72 * 4);
        uVar73 = (ulong)*(uint *)(uVar82 + 0x20 + lVar63);
        auVar85 = *(undefined1 (*) [16])(lVar70 + uVar73 * 4);
        uVar62 = (ulong)*(uint *)(uVar82 + 0x30 + lVar63);
        auVar136 = *(undefined1 (*) [16])(lVar70 + uVar62 * 4);
        local_2950 = *(long *)&pRVar8[*(uint *)(uVar82 + 0x44 + lVar63)].ptr[2].numPrimitives;
        lVar70 = *(long *)(local_2950 + lVar76);
        auVar124 = *(undefined1 (*) [16])(lVar70 + local_2940 * 4);
        local_2930 = (ulong)*(uint *)(uVar82 + 0x14 + lVar63);
        auVar99 = *(undefined1 (*) [16])(lVar70 + local_2930 * 4);
        local_2928 = (ulong)*(uint *)(uVar82 + 0x24 + lVar63);
        auVar125 = *(undefined1 (*) [16])(lVar70 + local_2928 * 4);
        uVar75 = (ulong)*(uint *)(uVar82 + 0x34 + lVar63);
        auVar111 = *(undefined1 (*) [16])(lVar70 + uVar75 * 4);
        lVar70 = *(long *)&pRVar8[*(uint *)(uVar82 + 0x48 + lVar63)].ptr[2].numPrimitives;
        lVar10 = *(long *)(lVar70 + lVar76);
        uVar74 = (ulong)*(uint *)(uVar82 + 8 + lVar63);
        auVar120 = *(undefined1 (*) [16])(lVar10 + uVar74 * 4);
        uVar83 = (ulong)*(uint *)(uVar82 + 0x18 + lVar63);
        auVar121 = *(undefined1 (*) [16])(lVar10 + uVar83 * 4);
        local_2948 = (ulong)*(uint *)(uVar82 + 0x28 + lVar63);
        auVar197 = *(undefined1 (*) [16])(lVar10 + local_2948 * 4);
        local_2938 = (ulong)*(uint *)(uVar82 + 0x38 + lVar63);
        auVar130 = *(undefined1 (*) [16])(lVar10 + local_2938 * 4);
        fVar84 = fVar84 - auVar13._0_4_;
        local_2790 = ZEXT416((uint)fVar84);
        lVar10 = *(long *)&pRVar8[*(uint *)(uVar82 + 0x4c + lVar63)].ptr[2].numPrimitives;
        lVar76 = *(long *)(lVar10 + lVar76);
        uVar66 = (ulong)*(uint *)(uVar82 + 0xc + lVar63);
        auVar13 = *(undefined1 (*) [16])(lVar76 + uVar66 * 4);
        uVar80 = (ulong)*(uint *)(uVar82 + 0x1c + lVar63);
        auVar6 = *(undefined1 (*) [16])(lVar76 + uVar80 * 4);
        auVar101 = vunpcklps_avx(auVar110,auVar120);
        auVar120 = vunpckhps_avx(auVar110,auVar120);
        auVar40 = vunpcklps_avx(auVar124,auVar13);
        auVar124 = vunpckhps_avx(auVar124,auVar13);
        uVar77 = (ulong)*(uint *)(uVar82 + 0x2c + lVar63);
        auVar110 = *(undefined1 (*) [16])(lVar76 + uVar77 * 4);
        _local_27b0 = vunpcklps_avx(auVar120,auVar124);
        _local_27f0 = vunpcklps_avx(auVar101,auVar40);
        _local_27d0 = vunpckhps_avx(auVar101,auVar40);
        auVar120 = vunpcklps_avx(auVar100,auVar121);
        auVar124 = vunpckhps_avx(auVar100,auVar121);
        auVar121 = vunpcklps_avx(auVar99,auVar6);
        auVar99 = vunpckhps_avx(auVar99,auVar6);
        uVar79 = (ulong)*(uint *)(uVar82 + 0x3c + lVar63);
        auVar100 = *(undefined1 (*) [16])(lVar76 + uVar79 * 4);
        _local_27a0 = vunpcklps_avx(auVar124,auVar99);
        _local_27e0 = vunpcklps_avx(auVar120,auVar121);
        _local_27c0 = vunpckhps_avx(auVar120,auVar121);
        auVar99 = vunpcklps_avx(auVar85,auVar197);
        auVar85 = vunpckhps_avx(auVar85,auVar197);
        auVar120 = vunpcklps_avx(auVar125,auVar110);
        auVar124 = vunpckhps_avx(auVar125,auVar110);
        lVar81 = (long)(iVar65 + 1) * 0x38;
        lVar76 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar81);
        auVar110 = *(undefined1 (*) [16])(lVar76 + (ulong)*(uint *)(uVar82 + lVar63) * 4);
        _local_2800 = vunpcklps_avx(auVar85,auVar124);
        _local_2840 = vunpcklps_avx(auVar99,auVar120);
        _local_2830 = vunpckhps_avx(auVar99,auVar120);
        auVar124 = vunpcklps_avx(auVar136,auVar130);
        auVar85 = vunpckhps_avx(auVar136,auVar130);
        auVar99 = vunpcklps_avx(auVar111,auVar100);
        auVar136 = vunpckhps_avx(auVar111,auVar100);
        lVar70 = *(long *)(lVar70 + lVar81);
        auVar100 = *(undefined1 (*) [16])(lVar70 + uVar74 * 4);
        _local_2810 = vunpcklps_avx(auVar85,auVar136);
        auVar125 = vunpcklps_avx(auVar124,auVar99);
        _local_2820 = vunpckhps_avx(auVar124,auVar99);
        lVar11 = *(long *)(local_2950 + lVar81);
        auVar136 = vunpcklps_avx(auVar110,auVar100);
        auVar85 = vunpckhps_avx(auVar110,auVar100);
        auVar110 = *(undefined1 (*) [16])(lVar11 + local_2940 * 4);
        lVar10 = *(long *)(lVar10 + lVar81);
        auVar100 = *(undefined1 (*) [16])(lVar10 + uVar66 * 4);
        auVar124 = vunpcklps_avx(auVar110,auVar100);
        auVar110 = vunpckhps_avx(auVar110,auVar100);
        auVar111 = vunpcklps_avx(auVar85,auVar110);
        auVar120 = vunpcklps_avx(auVar136,auVar124);
        auVar85 = vunpckhps_avx(auVar136,auVar124);
        auVar110 = *(undefined1 (*) [16])(lVar76 + uVar72 * 4);
        auVar100 = *(undefined1 (*) [16])(lVar70 + uVar83 * 4);
        auVar124 = vunpcklps_avx(auVar110,auVar100);
        auVar136 = vunpckhps_avx(auVar110,auVar100);
        auVar110 = *(undefined1 (*) [16])(lVar11 + local_2930 * 4);
        auVar100 = *(undefined1 (*) [16])(lVar10 + uVar80 * 4);
        auVar99 = vunpcklps_avx(auVar110,auVar100);
        auVar110 = vunpckhps_avx(auVar110,auVar100);
        auVar121 = vunpcklps_avx(auVar136,auVar110);
        auVar197 = vunpcklps_avx(auVar124,auVar99);
        auVar136 = vunpckhps_avx(auVar124,auVar99);
        auVar110 = *(undefined1 (*) [16])(lVar76 + uVar73 * 4);
        auVar100 = *(undefined1 (*) [16])(lVar70 + local_2948 * 4);
        auVar99 = vunpcklps_avx(auVar110,auVar100);
        auVar124 = vunpckhps_avx(auVar110,auVar100);
        auVar110 = *(undefined1 (*) [16])(lVar11 + local_2928 * 4);
        auVar100 = *(undefined1 (*) [16])(lVar10 + uVar77 * 4);
        auVar130 = vunpcklps_avx(auVar110,auVar100);
        auVar110 = vunpckhps_avx(auVar110,auVar100);
        auVar13 = vunpcklps_avx(auVar124,auVar110);
        auVar6 = vunpcklps_avx(auVar99,auVar130);
        auVar124 = vunpckhps_avx(auVar99,auVar130);
        auVar110 = *(undefined1 (*) [16])(lVar76 + uVar62 * 4);
        auVar100 = *(undefined1 (*) [16])(lVar70 + local_2938 * 4);
        auVar130 = vunpcklps_avx(auVar110,auVar100);
        auVar99 = vunpckhps_avx(auVar110,auVar100);
        auVar110 = *(undefined1 (*) [16])(lVar11 + uVar75 * 4);
        auVar100 = *(undefined1 (*) [16])(lVar10 + uVar79 * 4);
        auVar101 = vunpcklps_avx(auVar110,auVar100);
        auVar110 = vunpckhps_avx(auVar110,auVar100);
        auVar40 = vunpcklps_avx(auVar99,auVar110);
        auVar41 = vunpcklps_avx(auVar130,auVar101);
        auVar99 = vunpckhps_avx(auVar130,auVar101);
        auVar110 = vshufps_avx(local_2790,local_2790,0);
        auVar100 = ZEXT416((uint)(1.0 - fVar84));
        auVar100 = vshufps_avx(auVar100,auVar100,0);
        fVar84 = auVar110._0_4_;
        fVar93 = auVar110._4_4_;
        fVar94 = auVar110._8_4_;
        fVar95 = auVar110._12_4_;
        fVar96 = auVar100._0_4_;
        fVar97 = auVar100._4_4_;
        fVar98 = auVar100._8_4_;
        fVar109 = auVar100._12_4_;
        auVar128._4_4_ = fVar97 * (float)local_27f0._4_4_ + auVar120._4_4_ * fVar93;
        auVar128._0_4_ = fVar96 * (float)local_27f0._0_4_ + auVar120._0_4_ * fVar84;
        auVar128._8_4_ = fVar98 * fStack_27e8 + auVar120._8_4_ * fVar94;
        auVar128._12_4_ = fVar109 * fStack_27e4 + auVar120._12_4_ * fVar95;
        auVar138._4_4_ = fVar97 * (float)local_27d0._4_4_ + fVar93 * auVar85._4_4_;
        auVar138._0_4_ = fVar96 * (float)local_27d0._0_4_ + fVar84 * auVar85._0_4_;
        auVar138._8_4_ = fVar98 * fStack_27c8 + fVar94 * auVar85._8_4_;
        auVar138._12_4_ = fVar109 * fStack_27c4 + fVar95 * auVar85._12_4_;
        auVar174._4_4_ = fVar97 * (float)local_27b0._4_4_ + auVar111._4_4_ * fVar93;
        auVar174._0_4_ = fVar96 * (float)local_27b0._0_4_ + auVar111._0_4_ * fVar84;
        auVar174._8_4_ = fVar98 * fStack_27a8 + auVar111._8_4_ * fVar94;
        auVar174._12_4_ = fVar109 * fStack_27a4 + auVar111._12_4_ * fVar95;
        auVar130._0_4_ = fVar96 * (float)local_27e0._0_4_ + fVar84 * auVar197._0_4_;
        auVar130._4_4_ = fVar97 * (float)local_27e0._4_4_ + fVar93 * auVar197._4_4_;
        auVar130._8_4_ = fVar98 * fStack_27d8 + fVar94 * auVar197._8_4_;
        auVar130._12_4_ = fVar109 * fStack_27d4 + fVar95 * auVar197._12_4_;
        auVar111._0_4_ = fVar96 * (float)local_27c0._0_4_ + auVar136._0_4_ * fVar84;
        auVar111._4_4_ = fVar97 * (float)local_27c0._4_4_ + auVar136._4_4_ * fVar93;
        auVar111._8_4_ = fVar98 * fStack_27b8 + auVar136._8_4_ * fVar94;
        auVar111._12_4_ = fVar109 * fStack_27b4 + auVar136._12_4_ * fVar95;
        auVar197._0_4_ = fVar96 * (float)local_27a0._0_4_ + auVar121._0_4_ * fVar84;
        auVar197._4_4_ = fVar97 * (float)local_27a0._4_4_ + auVar121._4_4_ * fVar93;
        auVar197._8_4_ = fVar98 * fStack_2798 + auVar121._8_4_ * fVar94;
        auVar197._12_4_ = fVar109 * fStack_2794 + auVar121._12_4_ * fVar95;
        auVar128._20_4_ = fVar97 * (float)local_2840._4_4_ + fVar93 * auVar6._4_4_;
        auVar128._16_4_ = fVar96 * (float)local_2840._0_4_ + fVar84 * auVar6._0_4_;
        auVar128._24_4_ = fVar98 * fStack_2838 + fVar94 * auVar6._8_4_;
        auVar128._28_4_ = fVar109 * fStack_2834 + fVar95 * auVar6._12_4_;
        auVar138._20_4_ = fVar97 * (float)local_2830._4_4_ + auVar124._4_4_ * fVar93;
        auVar138._16_4_ = fVar96 * (float)local_2830._0_4_ + auVar124._0_4_ * fVar84;
        auVar138._24_4_ = fVar98 * fStack_2828 + auVar124._8_4_ * fVar94;
        auVar138._28_4_ = fVar109 * fStack_2824 + auVar124._12_4_ * fVar95;
        auVar174._20_4_ = fVar97 * (float)local_2800._4_4_ + auVar13._4_4_ * fVar93;
        auVar174._16_4_ = fVar96 * (float)local_2800._0_4_ + auVar13._0_4_ * fVar84;
        auVar174._24_4_ = fVar98 * fStack_27f8 + auVar13._8_4_ * fVar94;
        fVar152 = fVar109 * fStack_27f4 + auVar13._12_4_ * fVar95;
        auVar174._28_4_ = fVar152;
        lVar70 = uVar82 + 0x40 + lVar63;
        local_23c0 = *(undefined8 *)(lVar70 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar70 + 0x18);
        auVar120._0_4_ = auVar125._0_4_ * fVar96 + fVar84 * auVar41._0_4_;
        auVar120._4_4_ = auVar125._4_4_ * fVar97 + fVar93 * auVar41._4_4_;
        auVar120._8_4_ = auVar125._8_4_ * fVar98 + fVar94 * auVar41._8_4_;
        auVar120._12_4_ = auVar125._12_4_ * fVar109 + fVar95 * auVar41._12_4_;
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        lVar63 = uVar82 + 0x50 + lVar63;
        local_2780 = *(undefined8 *)(lVar63 + 0x10);
        uStack_2778 = *(undefined8 *)(lVar63 + 0x18);
        auVar125._0_4_ = fVar96 * (float)local_2820._0_4_ + fVar84 * auVar99._0_4_;
        auVar125._4_4_ = fVar97 * (float)local_2820._4_4_ + fVar93 * auVar99._4_4_;
        auVar125._8_4_ = fVar98 * fStack_2818 + fVar94 * auVar99._8_4_;
        auVar125._12_4_ = fVar109 * fStack_2814 + fVar95 * auVar99._12_4_;
        auVar136._0_4_ = fVar96 * (float)local_2810._0_4_ + fVar84 * auVar40._0_4_;
        auVar136._4_4_ = fVar97 * (float)local_2810._4_4_ + fVar93 * auVar40._4_4_;
        auVar136._8_4_ = fVar98 * fStack_2808 + fVar94 * auVar40._8_4_;
        auVar136._12_4_ = fVar109 * fStack_2804 + fVar95 * auVar40._12_4_;
        uStack_2770 = local_2780;
        uStack_2768 = uStack_2778;
        auVar104._16_16_ = auVar130;
        auVar104._0_16_ = auVar130;
        auVar113._16_16_ = auVar111;
        auVar113._0_16_ = auVar111;
        auVar131._16_16_ = auVar197;
        auVar131._0_16_ = auVar197;
        auVar148._16_16_ = auVar120;
        auVar148._0_16_ = auVar120;
        auVar127._16_16_ = auVar125;
        auVar127._0_16_ = auVar125;
        auVar86._16_16_ = auVar136;
        auVar86._0_16_ = auVar136;
        auVar102 = vsubps_avx(auVar128,auVar104);
        auVar116 = vsubps_avx(auVar138,auVar113);
        auVar137 = vsubps_avx(auVar174,auVar131);
        auVar103 = vsubps_avx(auVar148,auVar128);
        auVar37 = vsubps_avx(auVar127,auVar138);
        auVar38 = vsubps_avx(auVar86,auVar174);
        fVar95 = auVar116._0_4_;
        fVar181 = auVar38._0_4_;
        fVar134 = auVar116._4_4_;
        fVar183 = auVar38._4_4_;
        auVar45._4_4_ = fVar183 * fVar134;
        auVar45._0_4_ = fVar181 * fVar95;
        fVar175 = auVar116._8_4_;
        fVar184 = auVar38._8_4_;
        auVar45._8_4_ = fVar184 * fVar175;
        fVar4 = auVar116._12_4_;
        fVar185 = auVar38._12_4_;
        auVar45._12_4_ = fVar185 * fVar4;
        fVar19 = auVar116._16_4_;
        fVar186 = auVar38._16_4_;
        auVar45._16_4_ = fVar186 * fVar19;
        fVar25 = auVar116._20_4_;
        fVar187 = auVar38._20_4_;
        auVar45._20_4_ = fVar187 * fVar25;
        fVar31 = auVar116._24_4_;
        fVar188 = auVar38._24_4_;
        auVar45._24_4_ = fVar188 * fVar31;
        auVar45._28_4_ = auVar136._12_4_;
        fVar96 = auVar137._0_4_;
        fVar162 = auVar37._0_4_;
        fVar165 = auVar137._4_4_;
        fVar163 = auVar37._4_4_;
        auVar46._4_4_ = fVar163 * fVar165;
        auVar46._0_4_ = fVar162 * fVar96;
        fVar176 = auVar137._8_4_;
        fVar164 = auVar37._8_4_;
        auVar46._8_4_ = fVar164 * fVar176;
        fVar14 = auVar137._12_4_;
        fVar166 = auVar37._12_4_;
        auVar46._12_4_ = fVar166 * fVar14;
        fVar20 = auVar137._16_4_;
        fVar168 = auVar37._16_4_;
        auVar46._16_4_ = fVar168 * fVar20;
        fVar26 = auVar137._20_4_;
        fVar170 = auVar37._20_4_;
        auVar46._20_4_ = fVar170 * fVar26;
        fVar32 = auVar137._24_4_;
        fVar172 = auVar37._24_4_;
        auVar46._24_4_ = fVar172 * fVar32;
        auVar46._28_4_ = auVar130._12_4_;
        local_2640 = vsubps_avx(auVar46,auVar45);
        fVar146 = auVar103._0_4_;
        fVar149 = auVar103._4_4_;
        auVar137._4_4_ = fVar149 * fVar165;
        auVar137._0_4_ = fVar146 * fVar96;
        fVar150 = auVar103._8_4_;
        auVar137._8_4_ = fVar150 * fVar176;
        fVar153 = auVar103._12_4_;
        auVar137._12_4_ = fVar153 * fVar14;
        fVar155 = auVar103._16_4_;
        auVar137._16_4_ = fVar155 * fVar20;
        fVar157 = auVar103._20_4_;
        auVar137._20_4_ = fVar157 * fVar26;
        fVar159 = auVar103._24_4_;
        auVar137._24_4_ = fVar159 * fVar32;
        auVar137._28_4_ = auVar130._12_4_;
        fVar189 = auVar102._0_4_;
        fVar191 = auVar102._4_4_;
        auVar47._4_4_ = fVar191 * fVar183;
        auVar47._0_4_ = fVar189 * fVar181;
        fVar192 = auVar102._8_4_;
        auVar47._8_4_ = fVar192 * fVar184;
        fVar193 = auVar102._12_4_;
        auVar47._12_4_ = fVar193 * fVar185;
        fVar194 = auVar102._16_4_;
        auVar47._16_4_ = fVar194 * fVar186;
        fVar195 = auVar102._20_4_;
        auVar47._20_4_ = fVar195 * fVar187;
        fVar196 = auVar102._24_4_;
        auVar47._24_4_ = fVar196 * fVar188;
        auVar47._28_4_ = auVar111._12_4_;
        _local_28e0 = vsubps_avx(auVar47,auVar137);
        auVar48._4_4_ = fVar191 * fVar163;
        auVar48._0_4_ = fVar189 * fVar162;
        auVar48._8_4_ = fVar192 * fVar164;
        auVar48._12_4_ = fVar193 * fVar166;
        auVar48._16_4_ = fVar194 * fVar168;
        auVar48._20_4_ = fVar195 * fVar170;
        auVar48._24_4_ = fVar196 * fVar172;
        auVar48._28_4_ = auVar111._12_4_;
        auVar49._4_4_ = fVar149 * fVar134;
        auVar49._0_4_ = fVar146 * fVar95;
        auVar49._8_4_ = fVar150 * fVar175;
        auVar49._12_4_ = fVar153 * fVar4;
        auVar49._16_4_ = fVar155 * fVar19;
        auVar49._20_4_ = fVar157 * fVar25;
        auVar49._24_4_ = fVar159 * fVar31;
        auVar49._28_4_ = auVar125._12_4_;
        uVar3 = *(undefined4 *)(ray + k * 4);
        auVar190._4_4_ = uVar3;
        auVar190._0_4_ = uVar3;
        auVar190._8_4_ = uVar3;
        auVar190._12_4_ = uVar3;
        auVar190._16_4_ = uVar3;
        auVar190._20_4_ = uVar3;
        auVar190._24_4_ = uVar3;
        auVar190._28_4_ = uVar3;
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar198._4_4_ = uVar3;
        auVar198._0_4_ = uVar3;
        auVar198._8_4_ = uVar3;
        auVar198._12_4_ = uVar3;
        auVar198._16_4_ = uVar3;
        auVar198._20_4_ = uVar3;
        auVar198._24_4_ = uVar3;
        auVar198._28_4_ = uVar3;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar199._4_4_ = uVar5;
        auVar199._0_4_ = uVar5;
        auVar199._8_4_ = uVar5;
        auVar199._12_4_ = uVar5;
        auVar199._16_4_ = uVar5;
        auVar199._20_4_ = uVar5;
        auVar199._24_4_ = uVar5;
        auVar199._28_4_ = uVar5;
        fVar84 = *(float *)(ray + k * 4 + 0x50);
        local_2880 = vsubps_avx(auVar49,auVar48);
        in_ZMM5 = ZEXT3264(local_2880);
        local_2860 = vsubps_avx(auVar128,auVar190);
        fVar93 = *(float *)(ray + k * 4 + 0x60);
        auVar102 = vsubps_avx(auVar138,auVar198);
        auVar116 = vsubps_avx(auVar174,auVar199);
        fVar135 = auVar116._0_4_;
        fVar140 = auVar116._4_4_;
        auVar50._4_4_ = fVar140 * fVar84;
        auVar50._0_4_ = fVar135 * fVar84;
        fVar141 = auVar116._8_4_;
        auVar50._8_4_ = fVar141 * fVar84;
        fVar142 = auVar116._12_4_;
        auVar50._12_4_ = fVar142 * fVar84;
        fVar143 = auVar116._16_4_;
        auVar50._16_4_ = fVar143 * fVar84;
        fVar144 = auVar116._20_4_;
        auVar50._20_4_ = fVar144 * fVar84;
        fVar145 = auVar116._24_4_;
        auVar50._24_4_ = fVar145 * fVar84;
        auVar50._28_4_ = fVar152;
        fVar97 = auVar102._0_4_;
        fVar167 = auVar102._4_4_;
        auVar51._4_4_ = fVar93 * fVar167;
        auVar51._0_4_ = fVar93 * fVar97;
        fVar177 = auVar102._8_4_;
        auVar51._8_4_ = fVar93 * fVar177;
        fVar15 = auVar102._12_4_;
        auVar51._12_4_ = fVar93 * fVar15;
        fVar21 = auVar102._16_4_;
        auVar51._16_4_ = fVar93 * fVar21;
        fVar27 = auVar102._20_4_;
        auVar51._20_4_ = fVar93 * fVar27;
        fVar33 = auVar102._24_4_;
        auVar51._24_4_ = fVar93 * fVar33;
        auVar51._28_4_ = uVar3;
        auVar116 = vsubps_avx(auVar51,auVar50);
        fVar94 = *(float *)(ray + k * 4 + 0x40);
        fVar98 = local_2860._0_4_;
        fVar169 = local_2860._4_4_;
        auVar52._4_4_ = fVar93 * fVar169;
        auVar52._0_4_ = fVar93 * fVar98;
        fVar178 = local_2860._8_4_;
        auVar52._8_4_ = fVar93 * fVar178;
        fVar16 = local_2860._12_4_;
        auVar52._12_4_ = fVar93 * fVar16;
        fVar22 = local_2860._16_4_;
        auVar52._16_4_ = fVar93 * fVar22;
        fVar28 = local_2860._20_4_;
        auVar52._20_4_ = fVar93 * fVar28;
        fVar34 = local_2860._24_4_;
        auVar52._24_4_ = fVar93 * fVar34;
        auVar52._28_4_ = uVar5;
        auVar53._4_4_ = fVar140 * fVar94;
        auVar53._0_4_ = fVar135 * fVar94;
        auVar53._8_4_ = fVar141 * fVar94;
        auVar53._12_4_ = fVar142 * fVar94;
        auVar53._16_4_ = fVar143 * fVar94;
        auVar53._20_4_ = fVar144 * fVar94;
        auVar53._24_4_ = fVar145 * fVar94;
        auVar53._28_4_ = auVar130._12_4_;
        auVar137 = vsubps_avx(auVar53,auVar52);
        auVar54._4_4_ = fVar94 * fVar167;
        auVar54._0_4_ = fVar94 * fVar97;
        auVar54._8_4_ = fVar94 * fVar177;
        auVar54._12_4_ = fVar94 * fVar15;
        auVar54._16_4_ = fVar94 * fVar21;
        auVar54._20_4_ = fVar94 * fVar27;
        auVar54._24_4_ = fVar94 * fVar33;
        auVar54._28_4_ = uVar5;
        auVar55._4_4_ = fVar169 * fVar84;
        auVar55._0_4_ = fVar98 * fVar84;
        auVar55._8_4_ = fVar178 * fVar84;
        auVar55._12_4_ = fVar16 * fVar84;
        auVar55._16_4_ = fVar22 * fVar84;
        auVar55._20_4_ = fVar28 * fVar84;
        auVar55._24_4_ = fVar34 * fVar84;
        auVar55._28_4_ = local_2860._28_4_;
        auVar39 = vsubps_avx(auVar55,auVar54);
        fVar109 = local_2880._0_4_;
        fVar171 = local_2880._4_4_;
        fVar179 = local_2880._8_4_;
        fVar17 = local_2880._12_4_;
        fVar23 = local_2880._16_4_;
        fVar29 = local_2880._20_4_;
        fVar35 = local_2880._24_4_;
        fVar152 = local_2640._0_4_;
        fVar173 = local_2640._4_4_;
        fVar180 = local_2640._8_4_;
        fVar18 = local_2640._12_4_;
        fVar24 = local_2640._16_4_;
        fVar30 = local_2640._20_4_;
        fVar36 = local_2640._24_4_;
        auVar87._0_4_ = fVar94 * fVar152 + fVar93 * fVar109 + (float)local_28e0._0_4_ * fVar84;
        auVar87._4_4_ = fVar94 * fVar173 + fVar93 * fVar171 + (float)local_28e0._4_4_ * fVar84;
        auVar87._8_4_ = fVar94 * fVar180 + fVar93 * fVar179 + fStack_28d8 * fVar84;
        auVar87._12_4_ = fVar94 * fVar18 + fVar93 * fVar17 + fStack_28d4 * fVar84;
        auVar87._16_4_ = fVar94 * fVar24 + fVar93 * fVar23 + fStack_28d0 * fVar84;
        auVar87._20_4_ = fVar94 * fVar30 + fVar93 * fVar29 + fStack_28cc * fVar84;
        auVar87._24_4_ = fVar94 * fVar36 + fVar93 * fVar35 + fStack_28c8 * fVar84;
        auVar87._28_4_ = fVar93 + fVar93 + fVar84;
        auVar114._8_4_ = 0x80000000;
        auVar114._0_8_ = 0x8000000080000000;
        auVar114._12_4_ = 0x80000000;
        auVar114._16_4_ = 0x80000000;
        auVar114._20_4_ = 0x80000000;
        auVar114._24_4_ = 0x80000000;
        auVar114._28_4_ = 0x80000000;
        auVar102 = vandps_avx(auVar87,auVar114);
        uVar147 = auVar102._0_4_;
        local_26c0._0_4_ =
             (float)(uVar147 ^
                    (uint)(fVar146 * auVar116._0_4_ +
                          fVar181 * auVar39._0_4_ + fVar162 * auVar137._0_4_));
        uVar61 = auVar102._4_4_;
        local_26c0._4_4_ =
             (float)(uVar61 ^ (uint)(fVar149 * auVar116._4_4_ +
                                    fVar183 * auVar39._4_4_ + fVar163 * auVar137._4_4_));
        uVar151 = auVar102._8_4_;
        local_26c0._8_4_ =
             (float)(uVar151 ^
                    (uint)(fVar150 * auVar116._8_4_ +
                          fVar184 * auVar39._8_4_ + fVar164 * auVar137._8_4_));
        uVar154 = auVar102._12_4_;
        local_26c0._12_4_ =
             (float)(uVar154 ^
                    (uint)(fVar153 * auVar116._12_4_ +
                          fVar185 * auVar39._12_4_ + fVar166 * auVar137._12_4_));
        uVar156 = auVar102._16_4_;
        local_26c0._16_4_ =
             (float)(uVar156 ^
                    (uint)(fVar155 * auVar116._16_4_ +
                          fVar186 * auVar39._16_4_ + fVar168 * auVar137._16_4_));
        uVar158 = auVar102._20_4_;
        local_26c0._20_4_ =
             (float)(uVar158 ^
                    (uint)(fVar157 * auVar116._20_4_ +
                          fVar187 * auVar39._20_4_ + fVar170 * auVar137._20_4_));
        uVar160 = auVar102._24_4_;
        local_26c0._24_4_ =
             (float)(uVar160 ^
                    (uint)(fVar159 * auVar116._24_4_ +
                          fVar188 * auVar39._24_4_ + fVar172 * auVar137._24_4_));
        uVar161 = auVar102._28_4_;
        local_26c0._28_4_ =
             (float)(uVar161 ^ (uint)(auVar103._28_4_ + auVar38._28_4_ + auVar37._28_4_));
        auVar119 = ZEXT3264(local_26c0);
        local_26a0._0_4_ =
             (float)(uVar147 ^
                    (uint)(auVar116._0_4_ * fVar189 +
                          fVar96 * auVar39._0_4_ + fVar95 * auVar137._0_4_));
        local_26a0._4_4_ =
             (float)(uVar61 ^ (uint)(auVar116._4_4_ * fVar191 +
                                    fVar165 * auVar39._4_4_ + fVar134 * auVar137._4_4_));
        local_26a0._8_4_ =
             (float)(uVar151 ^
                    (uint)(auVar116._8_4_ * fVar192 +
                          fVar176 * auVar39._8_4_ + fVar175 * auVar137._8_4_));
        local_26a0._12_4_ =
             (float)(uVar154 ^
                    (uint)(auVar116._12_4_ * fVar193 +
                          fVar14 * auVar39._12_4_ + fVar4 * auVar137._12_4_));
        local_26a0._16_4_ =
             (float)(uVar156 ^
                    (uint)(auVar116._16_4_ * fVar194 +
                          fVar20 * auVar39._16_4_ + fVar19 * auVar137._16_4_));
        local_26a0._20_4_ =
             (float)(uVar158 ^
                    (uint)(auVar116._20_4_ * fVar195 +
                          fVar26 * auVar39._20_4_ + fVar25 * auVar137._20_4_));
        local_26a0._24_4_ =
             (float)(uVar160 ^
                    (uint)(auVar116._24_4_ * fVar196 +
                          fVar32 * auVar39._24_4_ + fVar31 * auVar137._24_4_));
        local_26a0._28_4_ = (float)(uVar161 ^ (uint)(auVar39._28_4_ + auVar137._28_4_ + -0.0));
        in_ZMM4 = ZEXT3264(local_26a0);
        auVar116 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar102 = vcmpps_avx(local_26c0,auVar116,5);
        auVar116 = vcmpps_avx(local_26a0,auVar116,5);
        auVar102 = vandps_avx(auVar102,auVar116);
        auVar115._8_4_ = 0x7fffffff;
        auVar115._0_8_ = 0x7fffffff7fffffff;
        auVar115._12_4_ = 0x7fffffff;
        auVar115._16_4_ = 0x7fffffff;
        auVar115._20_4_ = 0x7fffffff;
        auVar115._24_4_ = 0x7fffffff;
        auVar115._28_4_ = 0x7fffffff;
        local_2660 = vandps_avx(auVar87,auVar115);
        auVar116 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar87,4);
        auVar102 = vandps_avx(auVar102,auVar116);
        auVar88._0_4_ = local_26c0._0_4_ + local_26a0._0_4_;
        auVar88._4_4_ = local_26c0._4_4_ + local_26a0._4_4_;
        auVar88._8_4_ = local_26c0._8_4_ + local_26a0._8_4_;
        auVar88._12_4_ = local_26c0._12_4_ + local_26a0._12_4_;
        auVar88._16_4_ = local_26c0._16_4_ + local_26a0._16_4_;
        auVar88._20_4_ = local_26c0._20_4_ + local_26a0._20_4_;
        auVar88._24_4_ = local_26c0._24_4_ + local_26a0._24_4_;
        auVar88._28_4_ = local_26c0._28_4_ + local_26a0._28_4_;
        auVar116 = vcmpps_avx(auVar88,local_2660,2);
        auVar137 = auVar116 & auVar102;
        if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar137 >> 0x7f,0) != '\0') ||
              (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar137 >> 0xbf,0) != '\0') ||
            (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar137[0x1f] < '\0') {
          auVar102 = vandps_avx(auVar102,auVar116);
          auVar110 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          local_2680._0_4_ =
               (float)(uVar147 ^
                      (uint)(fVar152 * fVar98 + (float)local_28e0._0_4_ * fVar97 + fVar135 * fVar109
                            ));
          local_2680._4_4_ =
               (float)(uVar61 ^ (uint)(fVar173 * fVar169 +
                                      (float)local_28e0._4_4_ * fVar167 + fVar140 * fVar171));
          local_2680._8_4_ =
               (float)(uVar151 ^
                      (uint)(fVar180 * fVar178 + fStack_28d8 * fVar177 + fVar141 * fVar179));
          local_2680._12_4_ =
               (float)(uVar154 ^ (uint)(fVar18 * fVar16 + fStack_28d4 * fVar15 + fVar142 * fVar17));
          local_2680._16_4_ =
               (float)(uVar156 ^ (uint)(fVar24 * fVar22 + fStack_28d0 * fVar21 + fVar143 * fVar23));
          local_2680._20_4_ =
               (float)(uVar158 ^ (uint)(fVar30 * fVar28 + fStack_28cc * fVar27 + fVar144 * fVar29));
          local_2680._24_4_ =
               (float)(uVar160 ^ (uint)(fVar36 * fVar34 + fStack_28c8 * fVar33 + fVar145 * fVar35));
          local_2680._28_4_ = uVar161 ^ 0x7fc00000;
          fVar84 = *(float *)(ray + k * 4 + 0x30);
          fVar93 = local_2660._0_4_;
          fVar94 = local_2660._4_4_;
          auVar56._4_4_ = fVar94 * fVar84;
          auVar56._0_4_ = fVar93 * fVar84;
          fVar95 = local_2660._8_4_;
          auVar56._8_4_ = fVar95 * fVar84;
          fVar96 = local_2660._12_4_;
          auVar56._12_4_ = fVar96 * fVar84;
          fVar97 = local_2660._16_4_;
          auVar56._16_4_ = fVar97 * fVar84;
          fVar98 = local_2660._20_4_;
          auVar56._20_4_ = fVar98 * fVar84;
          fVar134 = local_2660._24_4_;
          auVar56._24_4_ = fVar134 * fVar84;
          auVar56._28_4_ = fVar84;
          auVar102 = vcmpps_avx(auVar56,local_2680,1);
          fVar84 = *(float *)(ray + k * 4 + 0x80);
          auVar57._4_4_ = fVar94 * fVar84;
          auVar57._0_4_ = fVar93 * fVar84;
          auVar57._8_4_ = fVar95 * fVar84;
          auVar57._12_4_ = fVar96 * fVar84;
          auVar57._16_4_ = fVar97 * fVar84;
          auVar57._20_4_ = fVar98 * fVar84;
          auVar57._24_4_ = fVar134 * fVar84;
          auVar57._28_4_ = fVar84;
          auVar116 = vcmpps_avx(local_2680,auVar57,2);
          auVar102 = vandps_avx(auVar102,auVar116);
          auVar100 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
          auVar110 = vpand_avx(auVar100,auVar110);
          auVar100 = vpmovzxwd_avx(auVar110);
          auVar136 = vpslld_avx(auVar100,0x1f);
          auVar85 = vpsrad_avx(auVar136,0x1f);
          auVar100 = vpunpckhwd_avx(auVar110,auVar110);
          auVar100 = vpslld_avx(auVar100,0x1f);
          auVar100 = vpsrad_avx(auVar100,0x1f);
          local_28a0._16_16_ = auVar100;
          local_28a0._0_16_ = auVar85;
          in_ZMM5 = ZEXT3264(local_28a0);
          if ((((((((local_28a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_28a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_28a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_28a0 >> 0x7f,0) != '\0') ||
                (local_28a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar100 >> 0x3f,0) != '\0') ||
              (local_28a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar100[0xf] < '\0') {
            local_2620 = (float)local_28e0._0_4_;
            fStack_261c = (float)local_28e0._4_4_;
            fStack_2618 = fStack_28d8;
            fStack_2614 = fStack_28d4;
            fStack_2610 = fStack_28d0;
            fStack_260c = fStack_28cc;
            fStack_2608 = fStack_28c8;
            uStack_2604 = uStack_28c4;
            local_2600 = local_2880;
            local_25e0 = local_28a0;
            local_2500 = local_24c0;
            auVar116 = vrcpps_avx(local_2660);
            fVar84 = auVar116._0_4_;
            auVar105._0_4_ = fVar93 * fVar84;
            fVar93 = auVar116._4_4_;
            auVar105._4_4_ = fVar94 * fVar93;
            fVar94 = auVar116._8_4_;
            auVar105._8_4_ = fVar95 * fVar94;
            fVar95 = auVar116._12_4_;
            auVar105._12_4_ = fVar96 * fVar95;
            fVar96 = auVar116._16_4_;
            auVar105._16_4_ = fVar97 * fVar96;
            fVar97 = auVar116._20_4_;
            auVar105._20_4_ = fVar98 * fVar97;
            fVar98 = auVar116._24_4_;
            auVar105._24_4_ = fVar134 * fVar98;
            auVar105._28_4_ = 0;
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = &DAT_3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar132._16_4_ = 0x3f800000;
            auVar132._20_4_ = 0x3f800000;
            auVar132._24_4_ = 0x3f800000;
            auVar132._28_4_ = 0x3f800000;
            auVar137 = vsubps_avx(auVar132,auVar105);
            fVar84 = fVar84 + fVar84 * auVar137._0_4_;
            fVar93 = fVar93 + fVar93 * auVar137._4_4_;
            fVar94 = fVar94 + fVar94 * auVar137._8_4_;
            fVar95 = fVar95 + fVar95 * auVar137._12_4_;
            fVar96 = fVar96 + fVar96 * auVar137._16_4_;
            fVar97 = fVar97 + fVar97 * auVar137._20_4_;
            fVar98 = fVar98 + fVar98 * auVar137._24_4_;
            local_2580._4_4_ = local_2680._4_4_ * fVar93;
            local_2580._0_4_ = local_2680._0_4_ * fVar84;
            local_2580._8_4_ = local_2680._8_4_ * fVar94;
            local_2580._12_4_ = local_2680._12_4_ * fVar95;
            local_2580._16_4_ = local_2680._16_4_ * fVar96;
            local_2580._20_4_ = local_2680._20_4_ * fVar97;
            local_2580._24_4_ = local_2680._24_4_ * fVar98;
            local_2580._28_4_ = local_2680._28_4_;
            auVar92 = ZEXT3264(local_2580);
            auVar58._4_4_ = fVar93 * local_26c0._4_4_;
            auVar58._0_4_ = fVar84 * local_26c0._0_4_;
            auVar58._8_4_ = fVar94 * local_26c0._8_4_;
            auVar58._12_4_ = fVar95 * local_26c0._12_4_;
            auVar58._16_4_ = fVar96 * local_26c0._16_4_;
            auVar58._20_4_ = fVar97 * local_26c0._20_4_;
            auVar58._24_4_ = fVar98 * local_26c0._24_4_;
            auVar58._28_4_ = auVar137._28_4_;
            auVar102 = vminps_avx(auVar58,auVar132);
            auVar59._4_4_ = fVar93 * local_26a0._4_4_;
            auVar59._0_4_ = fVar84 * local_26a0._0_4_;
            auVar59._8_4_ = fVar94 * local_26a0._8_4_;
            auVar59._12_4_ = fVar95 * local_26a0._12_4_;
            auVar59._16_4_ = fVar96 * local_26a0._16_4_;
            auVar59._20_4_ = fVar97 * local_26a0._20_4_;
            auVar59._24_4_ = fVar98 * local_26a0._24_4_;
            auVar59._28_4_ = auVar116._28_4_ + auVar137._28_4_;
            auVar116 = vminps_avx(auVar59,auVar132);
            auVar137 = vsubps_avx(auVar132,auVar102);
            auVar103 = vsubps_avx(auVar132,auVar116);
            local_25a0 = vblendvps_avx(auVar116,auVar137,local_24c0);
            local_25c0 = vblendvps_avx(auVar102,auVar103,local_24c0);
            local_2560[0] = fVar152 * (float)local_24e0._0_4_;
            local_2560[1] = fVar173 * (float)local_24e0._4_4_;
            local_2560[2] = fVar180 * fStack_24d8;
            local_2560[3] = fVar18 * fStack_24d4;
            fStack_2550 = fVar24 * fStack_24d0;
            fStack_254c = fVar30 * fStack_24cc;
            fStack_2548 = fVar36 * fStack_24c8;
            uStack_2544 = local_25c0._28_4_;
            local_2540[0] = (float)local_28e0._0_4_ * (float)local_24e0._0_4_;
            local_2540[1] = (float)local_28e0._4_4_ * (float)local_24e0._4_4_;
            local_2540[2] = fStack_28d8 * fStack_24d8;
            local_2540[3] = fStack_28d4 * fStack_24d4;
            fStack_2530 = fStack_28d0 * fStack_24d0;
            fStack_252c = fStack_28cc * fStack_24cc;
            fStack_2528 = fStack_28c8 * fStack_24c8;
            uStack_2524 = auVar102._28_4_;
            local_2520[0] = fVar109 * (float)local_24e0._0_4_;
            local_2520[1] = fVar171 * (float)local_24e0._4_4_;
            local_2520[2] = fVar179 * fStack_24d8;
            local_2520[3] = fVar17 * fStack_24d4;
            fStack_2510 = fVar23 * fStack_24d0;
            fStack_250c = fVar29 * fStack_24cc;
            fStack_2508 = fVar35 * fStack_24c8;
            uStack_2504 = uStack_24c4;
            auVar100 = vpunpckhwd_avx(auVar110,auVar110);
            auVar100 = vpslld_avx(auVar100,0x1f);
            auVar89._16_16_ = auVar100;
            auVar89._0_16_ = auVar136;
            auVar106._8_4_ = 0x7f800000;
            auVar106._0_8_ = 0x7f8000007f800000;
            auVar106._12_4_ = 0x7f800000;
            auVar106._16_4_ = 0x7f800000;
            auVar106._20_4_ = 0x7f800000;
            auVar106._24_4_ = 0x7f800000;
            auVar106._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar106,local_2580,auVar89);
            auVar116 = vshufps_avx(auVar102,auVar102,0xb1);
            auVar116 = vminps_avx(auVar102,auVar116);
            auVar137 = vshufpd_avx(auVar116,auVar116,5);
            auVar116 = vminps_avx(auVar116,auVar137);
            auVar137 = vperm2f128_avx(auVar116,auVar116,1);
            auVar116 = vminps_avx(auVar116,auVar137);
            auVar102 = vcmpps_avx(auVar102,auVar116,0);
            auVar100 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
            auVar110 = vpand_avx(auVar100,auVar110);
            auVar100 = vpmovzxwd_avx(auVar110);
            auVar100 = vpslld_avx(auVar100,0x1f);
            auVar100 = vpsrad_avx(auVar100,0x1f);
            auVar110 = vpunpckhwd_avx(auVar110,auVar110);
            auVar110 = vpslld_avx(auVar110,0x1f);
            auVar110 = vpsrad_avx(auVar110,0x1f);
            auVar90._16_16_ = auVar110;
            auVar90._0_16_ = auVar100;
            if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar90 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar90 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar90 >> 0x7f,0) == '\0') &&
                  (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar110 >> 0x3f,0) == '\0') &&
                (auVar90 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar110[0xf]) {
              auVar90 = local_28a0;
            }
            uVar61 = vmovmskps_avx(auVar90);
            uVar147 = 0;
            local_2960 = pSVar7;
            local_2920 = lVar64;
            if (uVar61 != 0) {
              for (; (uVar61 >> uVar147 & 1) == 0; uVar147 = uVar147 + 1) {
              }
            }
LAB_004608c5:
            auVar119 = ZEXT3264(auVar103);
            uVar66 = (ulong)uVar147;
            uVar147 = *(uint *)((long)&local_23c0 + uVar66 * 4);
            pGVar9 = (pSVar7->geometries).items[uVar147].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_28a0 + uVar66 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar3 = *(undefined4 *)(local_25c0 + uVar66 * 4);
                uVar5 = *(undefined4 *)(local_25a0 + uVar66 * 4);
                *(float *)(ray + k * 4 + 0x80) = local_2560[uVar66 - 8];
                *(float *)(ray + k * 4 + 0xc0) = local_2560[uVar66];
                *(float *)(ray + k * 4 + 0xd0) = local_2540[uVar66];
                *(float *)(ray + k * 4 + 0xe0) = local_2520[uVar66];
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar5;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_2780 + uVar66 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar147;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_00460693;
              }
              local_28c0 = auVar92._0_32_;
              uVar3 = *(undefined4 *)(local_25c0 + uVar66 * 4);
              local_2720._4_4_ = uVar3;
              local_2720._0_4_ = uVar3;
              local_2720._8_4_ = uVar3;
              local_2720._12_4_ = uVar3;
              local_2710 = *(undefined4 *)(local_25a0 + uVar66 * 4);
              local_26f0 = vpshufd_avx(ZEXT416(uVar147),0);
              uVar3 = *(undefined4 *)((long)&local_2780 + uVar66 * 4);
              local_2700._4_4_ = uVar3;
              local_2700._0_4_ = uVar3;
              local_2700._8_4_ = uVar3;
              local_2700._12_4_ = uVar3;
              auVar119 = ZEXT1664(local_2700);
              fVar84 = local_2560[uVar66];
              auVar121._4_4_ = fVar84;
              auVar121._0_4_ = fVar84;
              auVar121._8_4_ = fVar84;
              auVar121._12_4_ = fVar84;
              in_ZMM4 = ZEXT1664(auVar121);
              fVar93 = local_2540[uVar66];
              local_2740._4_4_ = fVar93;
              local_2740._0_4_ = fVar93;
              local_2740._8_4_ = fVar93;
              local_2740._12_4_ = fVar93;
              in_ZMM5 = ZEXT1664(local_2740);
              fVar93 = local_2520[uVar66];
              local_2730._4_4_ = fVar93;
              local_2730._0_4_ = fVar93;
              local_2730._8_4_ = fVar93;
              local_2730._12_4_ = fVar93;
              local_2750[0] = (RTCHitN)SUB41(fVar84,0);
              local_2750[1] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_2750[2] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_2750[3] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              local_2750[4] = (RTCHitN)SUB41(fVar84,0);
              local_2750[5] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_2750[6] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_2750[7] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              local_2750[8] = (RTCHitN)SUB41(fVar84,0);
              local_2750[9] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_2750[10] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_2750[0xb] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              local_2750[0xc] = (RTCHitN)SUB41(fVar84,0);
              local_2750[0xd] = (RTCHitN)(char)((uint)fVar84 >> 8);
              local_2750[0xe] = (RTCHitN)(char)((uint)fVar84 >> 0x10);
              local_2750[0xf] = (RTCHitN)(char)((uint)fVar84 >> 0x18);
              uStack_270c = local_2710;
              uStack_2708 = local_2710;
              uStack_2704 = local_2710;
              vcmpps_avx(ZEXT1632(local_2720),ZEXT1632(local_2720),0xf);
              uStack_26dc = context->user->instID[0];
              local_26e0 = uStack_26dc;
              uStack_26d8 = uStack_26dc;
              uStack_26d4 = uStack_26dc;
              uStack_26d0 = context->user->instPrimID[0];
              uStack_26cc = uStack_26d0;
              uStack_26c8 = uStack_26d0;
              uStack_26c4 = uStack_26d0;
              local_28e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
              *(float *)(ray + k * 4 + 0x80) = local_2560[uVar66 - 8];
              local_2990 = *local_2980;
              uStack_2988 = local_2980[1];
              local_2910.valid = (int *)&local_2990;
              local_2910.geometryUserPtr = pGVar9->userPtr;
              local_2910.context = context->user;
              local_2910.hit = local_2750;
              local_2910.N = 4;
              local_2910.ray = (RTCRayN *)ray;
              if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar119 = ZEXT1664(local_2700);
                in_ZMM4 = ZEXT1664(auVar121);
                in_ZMM5 = ZEXT1664(local_2740);
                (*pGVar9->intersectionFilterN)(&local_2910);
              }
              auVar13._8_8_ = uStack_2988;
              auVar13._0_8_ = local_2990;
              if (auVar13 == (undefined1  [16])0x0) {
                auVar110 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                auVar110 = auVar110 ^ _DAT_01febe20;
              }
              else {
                p_Var12 = context->args->filter;
                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar119 = ZEXT1664(auVar119._0_16_);
                  in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                  in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                  (*p_Var12)(&local_2910);
                }
                auVar6._8_8_ = uStack_2988;
                auVar6._0_8_ = local_2990;
                auVar100 = vpcmpeqd_avx(auVar6,_DAT_01feba10);
                auVar110 = auVar100 ^ _DAT_01febe20;
                if (auVar6 != (undefined1  [16])0x0) {
                  auVar100 = auVar100 ^ _DAT_01febe20;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])local_2910.hit);
                  *(undefined1 (*) [16])(local_2910.ray + 0xc0) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x10));
                  *(undefined1 (*) [16])(local_2910.ray + 0xd0) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x20));
                  *(undefined1 (*) [16])(local_2910.ray + 0xe0) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x30));
                  *(undefined1 (*) [16])(local_2910.ray + 0xf0) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x40));
                  *(undefined1 (*) [16])(local_2910.ray + 0x100) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x50));
                  *(undefined1 (*) [16])(local_2910.ray + 0x110) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x60));
                  *(undefined1 (*) [16])(local_2910.ray + 0x120) = auVar85;
                  auVar85 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x70));
                  *(undefined1 (*) [16])(local_2910.ray + 0x130) = auVar85;
                  auVar100 = vmaskmovps_avx(auVar100,*(undefined1 (*) [16])(local_2910.hit + 0x80));
                  *(undefined1 (*) [16])(local_2910.ray + 0x140) = auVar100;
                }
              }
              auVar101._8_8_ = 0x100000001;
              auVar101._0_8_ = 0x100000001;
              if ((auVar101 & auVar110) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_28e0._0_4_;
              }
              *(undefined4 *)(local_28a0 + uVar66 * 4) = 0;
              uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar91._4_4_ = uVar3;
              auVar91._0_4_ = uVar3;
              auVar91._8_4_ = uVar3;
              auVar91._12_4_ = uVar3;
              auVar91._16_4_ = uVar3;
              auVar91._20_4_ = uVar3;
              auVar91._24_4_ = uVar3;
              auVar91._28_4_ = uVar3;
              auVar92 = ZEXT3264(local_28c0);
              auVar102 = vcmpps_avx(local_28c0,auVar91,2);
              local_28a0 = vandps_avx(auVar102,local_28a0);
            }
            if ((((((((local_28a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_28a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_28a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_28a0 >> 0x7f,0) == '\0') &&
                  (local_28a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_28a0 >> 0xbf,0) == '\0') &&
                (local_28a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_28a0[0x1f]) goto LAB_00460693;
            auVar107._8_4_ = 0x7f800000;
            auVar107._0_8_ = 0x7f8000007f800000;
            auVar107._12_4_ = 0x7f800000;
            auVar107._16_4_ = 0x7f800000;
            auVar107._20_4_ = 0x7f800000;
            auVar107._24_4_ = 0x7f800000;
            auVar107._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar107,auVar92._0_32_,local_28a0);
            auVar116 = vshufps_avx(auVar102,auVar102,0xb1);
            auVar116 = vminps_avx(auVar102,auVar116);
            auVar137 = vshufpd_avx(auVar116,auVar116,5);
            auVar116 = vminps_avx(auVar116,auVar137);
            auVar103 = vperm2f128_avx(auVar116,auVar116,1);
            auVar116 = vminps_avx(auVar116,auVar103);
            auVar116 = vcmpps_avx(auVar102,auVar116,0);
            auVar137 = local_28a0 & auVar116;
            auVar102 = local_28a0;
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar137 >> 0x7f,0) != '\0') ||
                  (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar137 >> 0xbf,0) != '\0') ||
                (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar137[0x1f] < '\0') {
              auVar102 = vandps_avx(auVar116,local_28a0);
            }
            uVar61 = vmovmskps_avx(auVar102);
            uVar147 = 0;
            if (uVar61 != 0) {
              for (; (uVar61 >> uVar147 & 1) == 0; uVar147 = uVar147 + 1) {
              }
            }
            goto LAB_004608c5;
          }
        }
LAB_00460693:
        lVar64 = lVar64 + 1;
      } while (lVar64 != local_2958);
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar92 = ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(uVar3,CONCAT412(
                                                  uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))))))));
    auVar129 = ZEXT3264(local_23e0);
    auVar133 = ZEXT3264(local_2400);
    auVar139 = ZEXT3264(local_2420);
    auVar182 = ZEXT3264(local_24a0);
    uVar66 = local_2970;
    uVar72 = local_2978;
    uVar73 = local_2968;
    fVar84 = local_2440;
    fVar93 = fStack_243c;
    fVar94 = fStack_2438;
    fVar95 = fStack_2434;
    fVar96 = fStack_2430;
    fVar97 = fStack_242c;
    fVar98 = fStack_2428;
    fVar109 = local_2460;
    fVar152 = fStack_245c;
    fVar134 = fStack_2458;
    fVar165 = fStack_2454;
    fVar167 = fStack_2450;
    fVar169 = fStack_244c;
    fVar171 = fStack_2448;
    fVar173 = local_2480;
    fVar175 = fStack_247c;
    fVar176 = fStack_2478;
    fVar177 = fStack_2474;
    fVar178 = fStack_2470;
    fVar179 = fStack_246c;
    fVar180 = fStack_2468;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }